

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenter.h
# Opt level: O2

uint16_t inv_recenter_nonneg(uint16_t r,uint16_t v)

{
  int iVar1;
  uint uVar2;
  undefined2 in_register_00000032;
  undefined6 in_register_0000003a;
  
  uVar2 = CONCAT22(in_register_00000032,v);
  iVar1 = (int)CONCAT62(in_register_0000003a,r);
  if (uVar2 <= (uint)(iVar1 * 2)) {
    if ((v & 1) == 0) {
      uVar2 = (uint)(v >> 1);
    }
    else {
      uVar2 = -(uVar2 + 1 >> 1);
    }
    uVar2 = iVar1 + uVar2;
  }
  return (uint16_t)uVar2;
}

Assistant:

static inline uint16_t inv_recenter_nonneg(uint16_t r, uint16_t v) {
  if (v > (r << 1))
    return v;
  else if ((v & 1) == 0)
    return (v >> 1) + r;
  else
    return r - ((v + 1) >> 1);
}